

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

unique_ptr<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>_> __thiscall
wallet::MakeSQLiteDatabase
          (wallet *this,path *path,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error)

{
  bool bVar1;
  SQLiteDatabase *this_00;
  SQLiteDatabase *pSVar2;
  long in_FS_OFFSET;
  path data_file;
  path local_f0;
  path local_b0;
  path local_88;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SQLiteDataFile((path *)&local_88,path);
  std::filesystem::__cxx11::path::parent_path();
  this_00 = (SQLiteDatabase *)operator_new(0xd8);
  std::filesystem::__cxx11::path::path(&local_60,&local_b0);
  std::filesystem::__cxx11::path::path(&local_f0,&local_60);
  SQLiteDatabase::SQLiteDatabase(this_00,(path *)&local_f0,(path *)&local_88,options,false);
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_b0);
  if (options->verify == true) {
    bVar1 = SQLiteDatabase::Verify(this_00,error);
    if (!bVar1) {
      *status = FAILED_VERIFY;
      *(undefined8 *)this = 0;
      pSVar2 = (SQLiteDatabase *)0x0;
      goto LAB_00582a2a;
    }
  }
  *status = SUCCESS;
  pSVar2 = this_00;
  this_00 = (SQLiteDatabase *)0x0;
LAB_00582a2a:
  *(SQLiteDatabase **)this = pSVar2;
  if (this_00 != (SQLiteDatabase *)0x0) {
    (*(this_00->super_WalletDatabase)._vptr_WalletDatabase[1])(this_00);
  }
  std::filesystem::__cxx11::path::~path(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
            )(__uniq_ptr_data<wallet::SQLiteDatabase,_std::default_delete<wallet::SQLiteDatabase>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<SQLiteDatabase> MakeSQLiteDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    try {
        fs::path data_file = SQLiteDataFile(path);
        auto db = std::make_unique<SQLiteDatabase>(data_file.parent_path(), data_file, options);
        if (options.verify && !db->Verify(error)) {
            status = DatabaseStatus::FAILED_VERIFY;
            return nullptr;
        }
        status = DatabaseStatus::SUCCESS;
        return db;
    } catch (const std::runtime_error& e) {
        status = DatabaseStatus::FAILED_LOAD;
        error = Untranslated(e.what());
        return nullptr;
    }
}